

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v7::detail::vformat_to<char>
               (buffer<char> *buf,basic_string_view<char> format_str,
               basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
               args,locale_ref loc)

{
  undefined1 value [16];
  undefined1 value_00 [16];
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  format_args;
  basic_string_view<char> str;
  custom_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> custom;
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  char *last;
  undefined8 in_stack_fffffffffffffe08;
  undefined2 in_stack_fffffffffffffe10;
  undefined6 in_stack_fffffffffffffe12;
  undefined1 local_188 [8];
  format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  h;
  default_arg_formatter<fmt::v7::detail::buffer_appender<char>,_char> local_140;
  error_handler local_119;
  undefined1 auStack_118 [8];
  format_arg arg;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_f0;
  buffer_appender<char> out;
  buffer<char> *buf_local;
  locale_ref loc_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_local;
  basic_string_view<char> format_str_local;
  custom_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_a8;
  basic_string_view<char> local_98 [3];
  undefined1 *local_68;
  default_arg_formatter<fmt::v7::detail::buffer_appender<char>,_char> *local_60;
  char *local_50;
  char *p_1;
  writer write;
  char *pcStack_38;
  char c;
  char *p;
  char *end;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_18;
  size_t local_10;
  
  args_local.desc_ = (unsigned_long_long)args.field_1;
  loc_local.locale_ = (void *)args.desc_;
  args_local.field_1 =
       (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
        )format_str.data_;
  out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
       (back_insert_iterator<fmt::v7::detail::buffer<char>_>)buf;
  buffer_appender<char>::buffer_appender((buffer_appender<char> *)&local_f0,buf);
  sVar2 = basic_string_view<char>::size((basic_string_view<char> *)&args_local.field_1);
  if (sVar2 == 2) {
    pcVar3 = basic_string_view<char>::data((basic_string_view<char> *)&args_local.field_1);
    bVar1 = equal2(pcVar3,"{}");
    if (bVar1) {
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::get((format_arg *)auStack_118,
            (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
             *)&loc_local,0);
      bVar1 = basic_format_arg::operator_cast_to_bool((basic_format_arg *)auStack_118);
      if (bVar1) {
        local_140.out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
             (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
             (back_insert_iterator<fmt::v7::detail::buffer<char>_>)local_f0.container;
        local_140.args.desc_ = (unsigned_long_long)loc_local.locale_;
        local_140.args.field_1 =
             (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
              )args_local.desc_;
        local_68 = auStack_118;
        local_140.loc.locale_ = loc.locale_;
        local_60 = &local_140;
        switch(arg.value_.field_0.int128_value._8_4_) {
        case 0:
          break;
        case 1:
          default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                    ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                     &local_140,auStack_118._0_4_);
          return;
        case 2:
          default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                    ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                     &local_140,auStack_118._0_4_);
          return;
        case 3:
          default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                    ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                     &local_140,CONCAT44(auStack_118._4_4_,auStack_118._0_4_));
          return;
        case 4:
          default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                    ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                     &local_140,CONCAT44(auStack_118._4_4_,auStack_118._0_4_));
          return;
        case 5:
          value._8_2_ = in_stack_fffffffffffffe10;
          value._0_8_ = in_stack_fffffffffffffe08;
          value._10_6_ = in_stack_fffffffffffffe12;
          default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                    ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                     &local_140,(__int128)value);
          return;
        case 6:
          value_00._8_2_ = in_stack_fffffffffffffe10;
          value_00._0_8_ = in_stack_fffffffffffffe08;
          value_00._10_6_ = in_stack_fffffffffffffe12;
          default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                    ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                     &local_140,(unsigned___int128)value_00);
          return;
        case 7:
          default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                    ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                     &local_140,(bool)(auStack_118[0] & 1));
          return;
        case 8:
          default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                    ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                     &local_140,auStack_118[0]);
          return;
        case 9:
          default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                    ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                     &local_140,(float)auStack_118._0_4_);
          return;
        case 10:
          default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                    ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                     &local_140,(double)CONCAT44(auStack_118._4_4_,auStack_118._0_4_));
          return;
        case 0xb:
          default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                    ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                     &local_140,
                     (longdouble)
                     CONCAT28(arg.value_.field_0.int_value._0_2_,
                              CONCAT44(auStack_118._4_4_,auStack_118._0_4_)));
          return;
        case 0xc:
          default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                    ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                     &local_140,(char *)CONCAT44(auStack_118._4_4_,auStack_118._0_4_));
          return;
        case 0xd:
          basic_string_view<char>::basic_string_view
                    (local_98,(char *)CONCAT44(auStack_118._4_4_,auStack_118._0_4_),
                     CONCAT62(arg.value_.field_0.long_long_value._2_6_,
                              arg.value_.field_0.int_value._0_2_));
          default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                    ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                     &local_140,local_98[0]);
          return;
        case 0xe:
          default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                    ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                     &local_140,(void *)CONCAT44(auStack_118._4_4_,auStack_118._0_4_));
          return;
        case 0xf:
          custom.value._4_4_ = auStack_118._4_4_;
          custom.value._0_4_ = auStack_118._0_4_;
          custom.format._0_2_ = arg.value_.field_0.int_value._0_2_;
          custom.format._2_6_ = arg.value_.field_0.long_long_value._2_6_;
          basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::handle::handle((handle *)&local_a8,custom);
          default_arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>::operator()
                    (&local_140,(handle)local_a8);
          return;
        }
        default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                  ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)&local_140)
        ;
        return;
      }
      error_handler::on_error(&local_119,"argument not found");
    }
  }
  str.size_ = format_str.size_;
  str.data_ = (char *)args_local.field_1.values_;
  format_args.field_1 =
       (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
        )args_local.desc_;
  format_args.desc_ = (unsigned_long_long)loc_local.locale_;
  format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  ::format_handler((format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)local_188,(buffer_appender<char>)local_f0.container,str,format_args,loc);
  local_18 = args_local.field_1;
  local_10 = format_str.size_;
  end = basic_string_view<char>::data((basic_string_view<char> *)&local_18);
  sVar2 = basic_string_view<char>::size((basic_string_view<char> *)&local_18);
  last = end + sVar2;
  p_1 = (char *)local_188;
  pcVar3 = end;
  if ((long)last - (long)end < 0x20) {
    while (pcStack_38 = pcVar3, pcStack_38 != last) {
      pcVar3 = pcStack_38 + 1;
      write.handler_._7_1_ = *pcStack_38;
      if (write.handler_._7_1_ == '{') {
        format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        ::on_text((format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                   *)local_188,end,pcStack_38);
        end = parse_replacement_field<char,fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&>
                        (pcStack_38,last,
                         (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                          *)local_188);
        pcVar3 = end;
      }
      else if (write.handler_._7_1_ == '}') {
        if ((pcVar3 == last) || (*pcVar3 != '}')) {
          error_handler::on_error((error_handler *)local_188,"unmatched \'}\' in format string");
        }
        format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        ::on_text((format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                   *)local_188,end,pcVar3);
        end = pcStack_38 + 2;
        pcVar3 = end;
      }
    }
    format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::on_text((format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
               *)local_188,end,last);
  }
  else {
    while (end != last) {
      local_50 = end;
      if ((*end != '{') &&
         (bVar1 = find<false,char,char_const*>(end + 1,last,'{',&local_50), !bVar1)) {
        parse_format_string<false,_char,_fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&>
        ::writer::operator()((writer *)&p_1,end,last);
        return;
      }
      parse_format_string<false,_char,_fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&>
      ::writer::operator()((writer *)&p_1,end,local_50);
      end = parse_replacement_field<char,fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&>
                      (local_50,last,
                       (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                        *)local_188);
    }
  }
  return;
}

Assistant:

void detail::vformat_to(
    detail::buffer<Char>& buf, basic_string_view<Char> format_str,
    basic_format_args<buffer_context<type_identity_t<Char>>> args,
    detail::locale_ref loc) {
  using iterator = typename buffer_context<Char>::iterator;
  auto out = buffer_appender<Char>(buf);
  if (format_str.size() == 2 && equal2(format_str.data(), "{}")) {
    auto arg = args.get(0);
    if (!arg) error_handler().on_error("argument not found");
    visit_format_arg(default_arg_formatter<iterator, Char>{out, args, loc},
                     arg);
    return;
  }
  format_handler<iterator, Char, buffer_context<Char>> h(out, format_str, args,
                                                         loc);
  parse_format_string<false>(format_str, h);
}